

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall glslang::HlslGrammar::acceptPreQualifier(HlslGrammar *this,TQualifier *qualifier)

{
  bool bVar1;
  EHlslTokenClass EVar2;
  uint uVar3;
  TLayoutGeometry local_34 [5];
  TQualifier *local_20;
  TQualifier *qualifier_local;
  HlslGrammar *this_local;
  
  local_20 = qualifier;
  qualifier_local = (TQualifier *)this;
LAB_00673058:
  do {
    EVar2 = HlslTokenStream::peek(&this->super_HlslTokenStream);
    switch(EVar2) {
    case EHTokStatic:
      *(ulong *)&local_20->field_0x8 = *(ulong *)&local_20->field_0x8 & 0xffffffffffffff80 | 1;
      break;
    case EHTokConst:
      *(ulong *)&local_20->field_0x8 = *(ulong *)&local_20->field_0x8 & 0xffffffffffffff80 | 2;
      break;
    default:
      return true;
    case EHTokExtern:
      break;
    case EHTokUniform:
      *(ulong *)&local_20->field_0x8 = *(ulong *)&local_20->field_0x8 & 0xffffffffffffff80 | 5;
      break;
    case EHTokVolatile:
      *(ulong *)&local_20->field_0x8 =
           *(ulong *)&local_20->field_0x8 & 0xfffbffffffffffff | 0x4000000000000;
      break;
    case EHTokPrecise:
      *(ulong *)&local_20->field_0x8 =
           *(ulong *)&local_20->field_0x8 & 0xffffffefffffffff | 0x1000000000;
      break;
    case EHTokShared:
      break;
    case EHTokGroupShared:
      *(ulong *)&local_20->field_0x8 = *(ulong *)&local_20->field_0x8 & 0xffffffffffffff80 | 7;
      break;
    case EHTokLinear:
      *(ulong *)&local_20->field_0x8 =
           *(ulong *)&local_20->field_0x8 & 0xffffffffbfffffff | 0x40000000;
      break;
    case EHTokCentroid:
      *(ulong *)&local_20->field_0x8 =
           *(ulong *)&local_20->field_0x8 & 0xffffffffdfffffff | 0x20000000;
      break;
    case EHTokNointerpolation:
      *(ulong *)&local_20->field_0x8 =
           *(ulong *)&local_20->field_0x8 & 0xffffffff7fffffff | 0x80000000;
      break;
    case EHTokNoperspective:
      *(ulong *)&local_20->field_0x8 =
           *(ulong *)&local_20->field_0x8 & 0xffffffdfffffffff | 0x2000000000;
      break;
    case EHTokSample:
      *(ulong *)&local_20->field_0x8 =
           *(ulong *)&local_20->field_0x8 & 0xffffdfffffffffff | 0x200000000000;
      break;
    case EHTokRowMajor:
      *(ulong *)&local_20->field_0x8 =
           *(ulong *)&local_20->field_0x8 & 0x1fffffffffffffff | 0x4000000000000000;
      break;
    case EHTokColumnMajor:
      *(ulong *)&local_20->field_0x8 =
           *(ulong *)&local_20->field_0x8 & 0x1fffffffffffffff | 0x2000000000000000;
      break;
    case EHTokIn:
      if (((uint)*(undefined8 *)&local_20->field_0x8 & 0x7f) != 5) {
        uVar3 = 0x10;
        if (((uint)*(undefined8 *)&local_20->field_0x8 & 0x7f) == 0x11) {
          uVar3 = 0x12;
        }
        *(ulong *)&local_20->field_0x8 =
             *(ulong *)&local_20->field_0x8 & 0xffffffffffffff80 | (ulong)uVar3;
      }
      break;
    case EHTokOut:
      uVar3 = 0x11;
      if (((uint)*(undefined8 *)&local_20->field_0x8 & 0x7f) == 0x10) {
        uVar3 = 0x12;
      }
      *(ulong *)&local_20->field_0x8 =
           *(ulong *)&local_20->field_0x8 & 0xffffffffffffff80 | (ulong)uVar3;
      break;
    case EHTokInOut:
      *(ulong *)&local_20->field_0x8 = *(ulong *)&local_20->field_0x8 & 0xffffffffffffff80 | 0x12;
      break;
    case EHTokLayout:
      goto switchD_00673084_caseD_16;
    case EHTokGloballyCoherent:
      *(ulong *)&local_20->field_0x8 =
           *(ulong *)&local_20->field_0x8 & 0xfffdffffffffffff | 0x2000000000000;
      break;
    case EHTokInline:
      break;
    case EHTokPoint:
      *(ulong *)&local_20->field_0x8 = *(ulong *)&local_20->field_0x8 & 0xffffffffffffff80 | 0x10;
      local_34[4] = 1;
      bVar1 = HlslParseContext::handleInputGeometry
                        (this->parseContext,&(this->super_HlslTokenStream).token.loc,local_34 + 4);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        return false;
      }
      break;
    case EHTokLine:
      *(ulong *)&local_20->field_0x8 = *(ulong *)&local_20->field_0x8 & 0xffffffffffffff80 | 0x10;
      local_34[3] = 2;
      bVar1 = HlslParseContext::handleInputGeometry
                        (this->parseContext,&(this->super_HlslTokenStream).token.loc,local_34 + 3);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        return false;
      }
      break;
    case EHTokTriangle:
      *(ulong *)&local_20->field_0x8 = *(ulong *)&local_20->field_0x8 & 0xffffffffffffff80 | 0x10;
      local_34[2] = 5;
      bVar1 = HlslParseContext::handleInputGeometry
                        (this->parseContext,&(this->super_HlslTokenStream).token.loc,local_34 + 2);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        return false;
      }
      break;
    case EHTokLineAdj:
      *(ulong *)&local_20->field_0x8 = *(ulong *)&local_20->field_0x8 & 0xffffffffffffff80 | 0x10;
      local_34[1] = 3;
      bVar1 = HlslParseContext::handleInputGeometry
                        (this->parseContext,&(this->super_HlslTokenStream).token.loc,local_34 + 1);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        return false;
      }
      break;
    case EHTokTriangleAdj:
      *(ulong *)&local_20->field_0x8 = *(ulong *)&local_20->field_0x8 & 0xffffffffffffff80 | 0x10;
      local_34[0] = ElgTrianglesAdjacency;
      bVar1 = HlslParseContext::handleInputGeometry
                        (this->parseContext,&(this->super_HlslTokenStream).token.loc,local_34);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        return false;
      }
    }
    HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
  } while( true );
switchD_00673084_caseD_16:
  bVar1 = acceptLayoutQualifierList(this,local_20);
  if (!bVar1) {
    return false;
  }
  goto LAB_00673058;
}

Assistant:

bool HlslGrammar::acceptPreQualifier(TQualifier& qualifier)
{
    do {
        switch (peek()) {
        case EHTokStatic:
            qualifier.storage = EvqGlobal;
            break;
        case EHTokExtern:
            // TODO: no meaning in glslang?
            break;
        case EHTokShared:
            // TODO: hint
            break;
        case EHTokGroupShared:
            qualifier.storage = EvqShared;
            break;
        case EHTokUniform:
            qualifier.storage = EvqUniform;
            break;
        case EHTokConst:
            qualifier.storage = EvqConst;
            break;
        case EHTokVolatile:
            qualifier.volatil = true;
            break;
        case EHTokLinear:
            qualifier.smooth = true;
            break;
        case EHTokCentroid:
            qualifier.centroid = true;
            break;
        case EHTokNointerpolation:
            qualifier.flat = true;
            break;
        case EHTokNoperspective:
            qualifier.nopersp = true;
            break;
        case EHTokSample:
            qualifier.sample = true;
            break;
        case EHTokRowMajor:
            qualifier.layoutMatrix = ElmColumnMajor;
            break;
        case EHTokColumnMajor:
            qualifier.layoutMatrix = ElmRowMajor;
            break;
        case EHTokPrecise:
            qualifier.noContraction = true;
            break;
        case EHTokIn:
            if (qualifier.storage != EvqUniform) {
                qualifier.storage = (qualifier.storage == EvqOut) ? EvqInOut : EvqIn;
            }
            break;
        case EHTokOut:
            qualifier.storage = (qualifier.storage == EvqIn) ? EvqInOut : EvqOut;
            break;
        case EHTokInOut:
            qualifier.storage = EvqInOut;
            break;
        case EHTokLayout:
            if (! acceptLayoutQualifierList(qualifier))
                return false;
            continue;
        case EHTokGloballyCoherent:
            qualifier.coherent = true;
            break;
        case EHTokInline:
            // TODO: map this to SPIR-V function control
            break;

        // GS geometries: these are specified on stage input variables, and are an error (not verified here)
        // for output variables.
        case EHTokPoint:
            qualifier.storage = EvqIn;
            if (!parseContext.handleInputGeometry(token.loc, ElgPoints))
                return false;
            break;
        case EHTokLine:
            qualifier.storage = EvqIn;
            if (!parseContext.handleInputGeometry(token.loc, ElgLines))
                return false;
            break;
        case EHTokTriangle:
            qualifier.storage = EvqIn;
            if (!parseContext.handleInputGeometry(token.loc, ElgTriangles))
                return false;
            break;
        case EHTokLineAdj:
            qualifier.storage = EvqIn;
            if (!parseContext.handleInputGeometry(token.loc, ElgLinesAdjacency))
                return false;
            break;
        case EHTokTriangleAdj:
            qualifier.storage = EvqIn;
            if (!parseContext.handleInputGeometry(token.loc, ElgTrianglesAdjacency))
                return false;
            break;

        default:
            return true;
        }
        advanceToken();
    } while (true);
}